

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O0

bool __thiscall Quartet::operator<(Quartet *this,Quartet *rhs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Doublet *in_RSI;
  Doublet *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar2 = am((Quartet *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  iVar3 = am((Quartet *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (iVar2 < iVar3) {
    return true;
  }
  iVar3 = am((Quartet *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  iVar4 = am((Quartet *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
  if (iVar3 == iVar4) {
    bVar1 = Doublet::operator<(in_RSI,(Doublet *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    if (bVar1) {
      return true;
    }
    bVar1 = Doublet::operator==((Doublet *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI);
    if (bVar1) {
      bVar1 = Doublet::operator<(in_RSI,(Doublet *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
      if (bVar1) {
        return true;
      }
      bVar1 = Doublet::operator==((Doublet *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_RDI);
      if (bVar1) {
        if ((int)in_RDI[2].type < (int)in_RSI[2].type) {
          return true;
        }
        if ((in_RDI[2].type == in_RSI[2].type) &&
           (bVar1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                                   in_stack_ffffffffffffffc8), bVar1)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator<(const Quartet & rhs) const
    {
        if(am() < rhs.am())
            return true;
        else if(am() == rhs.am())
        {
            if(bra < rhs.bra)
                return true;
            else if(bra == rhs.bra)
            {
                if(ket < rhs.ket)
                    return true;
                else if(ket == rhs.ket)
                {
                    if(m < rhs.m)
                        return true;
                    else if(m == rhs.m)
                    {
                        if(tag < rhs.tag)
                            return true;
                    }
                }
            }
        }

        return false;
    }